

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void on_tcp_child_process_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  char *pcVar2;
  uv_buf_t uVar3;
  char *local_48;
  char *local_40;
  undefined1 auStack_30 [4];
  int r;
  uv_buf_t outbuf;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  outbuf.len = (size_t)buf;
  if (nread < 0) {
    if (nread != -0xfff) {
      pcVar2 = uv_strerror((int)nread);
      printf("error recving on tcp connection: %s\n",pcVar2);
      abort();
    }
    free(buf->base);
  }
  else {
    if (nread < 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x27e,"nread > 0");
      abort();
    }
    iVar1 = memcmp("world\n",buf->base,nread);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x27f,"memcmp(\"world\\n\", buf->base, nread) == 0");
      abort();
    }
    on_pipe_read_called = on_pipe_read_called + 1;
    free(*(void **)outbuf.len);
    uVar3 = uv_buf_init("hello again\n",0xc);
    local_48 = uVar3.base;
    _auStack_30 = local_48;
    local_40 = (char *)uVar3.len;
    outbuf.base = local_40;
    iVar1 = uv_write(&conn.tcp_write_req,tcp,(uv_buf_t *)auStack_30,1,tcp_connection_write_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x286,"r == 0");
      abort();
    }
    tcp_conn_read_cb_called = tcp_conn_read_cb_called + 1;
  }
  return;
}

Assistant:

static void on_tcp_child_process_read(uv_stream_t* tcp,
                                      ssize_t nread,
                                      const uv_buf_t* buf) {
  uv_buf_t outbuf;
  int r;

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on tcp connection: %s\n", uv_strerror(nread));
    abort();
  }

  ASSERT(nread > 0);
  ASSERT(memcmp("world\n", buf->base, nread) == 0);
  on_pipe_read_called++;
  free(buf->base);

  /* Write to the socket */
  outbuf = uv_buf_init("hello again\n", 12);
  r = uv_write(&conn.tcp_write_req, tcp, &outbuf, 1, tcp_connection_write_cb);
  ASSERT(r == 0);

  tcp_conn_read_cb_called++;
}